

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

int byte_alignment(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  do {
    if ((*(uint *)(in_RSI + 0x10) & 7) == 0) {
      return 0;
    }
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  } while (iVar1 == 0);
  **(undefined4 **)(in_RDI + 0x30) = 7;
  return -1;
}

Assistant:

static int byte_alignment(AV1_COMMON *const cm,
                          struct aom_read_bit_buffer *const rb) {
  while (rb->bit_offset & 7) {
    if (aom_rb_read_bit(rb)) {
      cm->error->error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }
  }
  return 0;
}